

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

void __thiscall Encoder::RecordInlineeFrame(Encoder *this,Func *inlinee,uint32 currentOffset)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  Type *pTVar5;
  List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  InlineeFrameRecord *pIVar6;
  undefined1 local_38 [8];
  NativeOffsetInlineeFramePair pair;
  
  bVar3 = Func::IsLoopBody(this->m_func);
  if (bVar3) {
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,InlineInJitLoopBodyPhase,sourceContextId,functionId);
    if (bVar3) {
      return;
    }
  }
  bVar3 = Func::IsSimpleJit(this->m_func);
  if (bVar3) {
    return;
  }
  if (inlinee->frameInfo != (InlineeFrameInfo *)0x0) {
    pIVar6 = inlinee->frameInfo->record;
    if (pIVar6 != (InlineeFrameRecord *)0x0) goto LAB_003f0849;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x3f9,"(record != nullptr)","record != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pIVar6 = (InlineeFrameRecord *)0x0;
LAB_003f0849:
  this_00 = this->m_inlineeFrameMap;
  iVar1 = (this_00->
          super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>)
          .count;
  if (0 < iVar1) {
    pTVar5 = JsUtil::
             List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_00,iVar1 + -1);
    if (pTVar5->record == pIVar6) {
      pTVar5->offset = currentOffset;
      return;
    }
    this_00 = this->m_inlineeFrameMap;
  }
  local_38._0_4_ = currentOffset;
  pair._0_8_ = pIVar6;
  JsUtil::
  List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this_00,(NativeOffsetInlineeFramePair *)local_38);
  return;
}

Assistant:

void Encoder::RecordInlineeFrame(Func* inlinee, uint32 currentOffset)
{
    // The only restriction for not supporting loop bodies is that inlinee frame map is created on FunctionEntryPointInfo & not
    // the base class EntryPointInfo.
    if (!(this->m_func->IsLoopBody() && PHASE_OFF(Js::InlineInJitLoopBodyPhase, this->m_func)) && !this->m_func->IsSimpleJit())
    {
        InlineeFrameRecord* record = nullptr;
        if (inlinee->frameInfo)
        {
            record = inlinee->frameInfo->record;
            Assert(record != nullptr);
        }
        if (m_inlineeFrameMap->Count() > 0)
        {
            // update existing record if the entry is the same.
            NativeOffsetInlineeFramePair& lastPair = m_inlineeFrameMap->Item(m_inlineeFrameMap->Count() - 1);

            if (lastPair.record == record)
            {
                lastPair.offset = currentOffset;
                return;
            }
        }
        NativeOffsetInlineeFramePair pair = { currentOffset, record };
        m_inlineeFrameMap->Add(pair);
    }
}